

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

longdouble * get_big_float(longdouble *__return_storage_ptr__,FMFieldPtr field,void *data)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  int iVar5;
  longdouble *plVar6;
  longdouble *extraout_RAX;
  undefined4 extraout_var;
  uint uVar7;
  long lVar8;
  void *data_00;
  longdouble in_ST0;
  double tmp;
  longdouble *local_28;
  undefined8 uStack_20;
  
  iVar5 = *(int *)((long)__return_storage_ptr__ + 0xc);
  if (iVar5 == 1) {
    plVar6 = (longdouble *)get_big_int((FMFieldPtr)__return_storage_ptr__,field);
  }
  else if (iVar5 == 2) {
    plVar6 = (longdouble *)get_big_unsigned((FMFieldPtr)__return_storage_ptr__,field);
  }
  else {
    if (iVar5 != 3) {
      get_big_float_cold_2();
      get_big_float(__return_storage_ptr__,field,data_00);
      return (longdouble *)(double)in_ST0;
    }
    uVar7 = *(uint *)((long)__return_storage_ptr__ + 8);
    plVar6 = (longdouble *)(ulong)uVar7;
    if (uVar7 == 0x10) {
      plVar6 = *(longdouble **)__return_storage_ptr__;
      puVar1 = (undefined8 *)((long)&field->offset + (long)plVar6);
      local_28 = (longdouble *)*puVar1;
      uStack_20 = puVar1[1];
      if (*(char *)(__return_storage_ptr__ + 1) != '\0') {
        plVar6 = (longdouble *)0xf00000000;
        lVar8 = 0;
        do {
          uVar4 = *(undefined1 *)((long)&local_28 + lVar8);
          *(undefined1 *)((long)&local_28 + lVar8) =
               *(undefined1 *)((long)&local_28 + ((ulong)plVar6 >> 0x20));
          *(undefined1 *)((long)&local_28 + ((ulong)plVar6 >> 0x20)) = uVar4;
          lVar8 = lVar8 + 1;
          plVar6 = plVar6 + -0x10000000;
        } while (lVar8 != 8);
      }
    }
    else if (uVar7 == 8) {
      plVar6 = *(longdouble **)((long)&field->offset + *(long *)__return_storage_ptr__);
      local_28 = plVar6;
      bVar2 = *(byte *)((long)__return_storage_ptr__ + 0x11);
      bVar3 = *(byte *)((long)__return_storage_ptr__ + 0x12);
      if (bVar2 != bVar3) {
        if (fm_reverse_float_formats[bVar3] == (uint)bVar2) {
          plVar6 = (longdouble *)0x700000000;
          lVar8 = 0;
          do {
            uVar4 = *(undefined1 *)((long)&local_28 + lVar8);
            *(undefined1 *)((long)&local_28 + lVar8) =
                 *(undefined1 *)((long)&local_28 + ((ulong)plVar6 >> 0x20));
            *(undefined1 *)((long)&local_28 + ((ulong)plVar6 >> 0x20)) = uVar4;
            lVar8 = lVar8 + 1;
            plVar6 = plVar6 + -0x10000000;
          } while (lVar8 != 4);
        }
        else {
          uVar7 = (uint)bVar2 << 0x10 | (uint)bVar3;
          if (uVar7 < 0x30001) {
            if (uVar7 == 0x10003) {
              return plVar6;
            }
            if (uVar7 == 0x20003) {
              return plVar6;
            }
          }
          else {
            if (uVar7 == 0x30002) {
              return plVar6;
            }
            if (uVar7 == 0x30001) {
              return plVar6;
            }
          }
          iVar5 = puts("unanticipated float conversion ");
          plVar6 = (longdouble *)CONCAT44(extraout_var,iVar5);
        }
      }
    }
    else if (uVar7 == 4) {
      plVar6 = (longdouble *)
               (ulong)*(uint *)((long)&field->offset + *(long *)__return_storage_ptr__);
    }
    else if (get_big_float::get_double_warn == 0) {
      get_big_float_cold_1();
      plVar6 = extraout_RAX;
    }
  }
  return plVar6;
}

Assistant:

static MAX_FLOAT_TYPE
get_big_float(FMFieldPtr field, void *data)
{
    if (field->data_type == float_type) {
	if (field->size == sizeof(float)) {
	    float tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(float));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(float));
	    tmp2 = tmp;
	    return tmp2;
	} else if (field->size == sizeof(double)) {
	    double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(double));
	    float_conversion((unsigned char *)&tmp, sizeof(double), 
			     (FMfloat_format)field->src_float_format,
			     (FMfloat_format)field->target_float_format);
	    tmp2 = tmp;
	    return tmp2;
#if SIZEOF_LONG_DOUBLE != 0
	} else if (field->size == sizeof(long double)) {
	    long double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset),
		   sizeof(long double));
	    if (field->byte_swap)
		byte_swap((char *) &tmp,
			  (int)sizeof(long double));
	    tmp2 = tmp;
	    return tmp2;
#endif
	} else {
	    static int get_double_warn = 0;
	    if (!get_double_warn) {
		fprintf(stderr, "Get Double failed!  Size problems.  File double size is %d.\n", field->size);
		get_double_warn++;
	    }
	    return 0.0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	/* 
	 * A concession to inter-compiler interoperability...  We
	 * shouldn't need the (double)(long) casts here.  If we don't
	 * use them, AND we're on a machine which doesn't support "long 
	 * long" and "long double" in native code, gcc generates calls 
	 * to libgcc and the resulting library can't be linked with
	 * anything but GCC.  This can be a problem for installed
	 * libraries.  Using the casts avoids that particular problem,
	 * at a cost of data loss in the case of someone converting a
	 * "long long" that doesn't fit in a long to a floating point
	 * value. 
	 */
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get Double failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}